

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.c
# Opt level: O3

int uv__make_socketpair(int *fds,int flags)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  
  if (uv__make_socketpair_no_cloexec == '\0') {
    iVar1 = socketpair(1,flags | 0x80001,0,fds);
    if (iVar1 == 0) {
      return 0;
    }
    piVar3 = __errno_location();
    if (*piVar3 != 0x16) {
      return -*piVar3;
    }
    uv__make_socketpair_no_cloexec = '\x01';
  }
  iVar1 = 0;
  iVar2 = socketpair(1,1,0,fds);
  if (iVar2 == 0) {
    uv__cloexec(*fds,1);
    uv__cloexec(fds[1],1);
    if (((uint)flags >> 0xb & 1) != 0) {
      uv__nonblock(*fds,1);
      uv__nonblock(fds[1],1);
    }
  }
  else {
    piVar3 = __errno_location();
    iVar1 = -*piVar3;
  }
  return iVar1;
}

Assistant:

int uv__make_socketpair(int fds[2], int flags) {
#if defined(__linux__)
  static int no_cloexec;

  if (no_cloexec)
    goto skip;

  if (socketpair(AF_UNIX, SOCK_STREAM | UV__SOCK_CLOEXEC | flags, 0, fds) == 0)
    return 0;

  /* Retry on EINVAL, it means SOCK_CLOEXEC is not supported.
   * Anything else is a genuine error.
   */
  if (errno != EINVAL)
    return -errno;

  no_cloexec = 1;

skip:
#endif

  if (socketpair(AF_UNIX, SOCK_STREAM, 0, fds))
    return -errno;

  uv__cloexec(fds[0], 1);
  uv__cloexec(fds[1], 1);

  if (flags & UV__F_NONBLOCK) {
    uv__nonblock(fds[0], 1);
    uv__nonblock(fds[1], 1);
  }

  return 0;
}